

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Transform * pbrt::LookAt(Transform *__return_storage_ptr__,Point3f *pos,Point3f *look,Vector3f *up)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  Float (*paFVar7) [4];
  long lVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 local_c0;
  float local_b8 [2];
  float local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  SquareMatrix<4> cameraToWorld;
  optional<pbrt::SquareMatrix<4>_> worldToCamera;
  
  paFVar7 = (Float (*) [4])&cameraToWorld;
  lVar8 = 0;
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  do {
    auVar9 = vpbroadcastq_avx512vl();
    uVar6 = vpcmpeqq_avx512vl(auVar9,auVar5);
    auVar14 = vpmovm2d_avx512vl(uVar6 & 0xf);
    auVar14 = vpsrld_avx(auVar14,0x1f);
    auVar14 = vcvtdq2ps_avx(auVar14);
    *paFVar7 = (Float  [4])auVar14;
    lVar8 = lVar8 + 1;
    paFVar7 = paFVar7 + 1;
  } while (lVar8 != 4);
  cameraToWorld.m[2][3] = (pos->super_Tuple3<pbrt::Point3,_float>).z;
  cameraToWorld.m[3][3] = 1.0;
  local_b8[0] = (look->super_Tuple3<pbrt::Point3,_float>).z - cameraToWorld.m[2][3];
  uVar6._0_4_ = (pos->super_Tuple3<pbrt::Point3,_float>).x;
  uVar6._4_4_ = (pos->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar6;
  cameraToWorld.m[1][3] = (Float)vextractps_avx(auVar14,1);
  uVar1 = (look->super_Tuple3<pbrt::Point3,_float>).x;
  uVar2 = (look->super_Tuple3<pbrt::Point3,_float>).y;
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13 = vsubps_avx(auVar13,auVar14);
  auVar12._0_4_ = auVar13._0_4_ * auVar13._0_4_;
  auVar12._4_4_ = auVar13._4_4_ * auVar13._4_4_;
  auVar12._8_4_ = auVar13._8_4_ * auVar13._8_4_;
  auVar12._12_4_ = auVar13._12_4_ * auVar13._12_4_;
  auVar14 = vmovshdup_avx(auVar12);
  auVar14 = vfmadd231ss_fma(auVar14,auVar13,auVar13);
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_b8[0]),ZEXT416((uint)local_b8[0]));
  cameraToWorld.m[0][3] = (Float)(undefined4)uVar6;
  if (auVar14._0_4_ < 0.0) {
    local_b0 = local_b8[0];
    local_a8 = auVar13;
    fVar10 = sqrtf(auVar14._0_4_);
    local_b8[0] = local_b0;
    auVar13 = local_a8;
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar10 = auVar14._0_4_;
  }
  auVar15._4_4_ = fVar10;
  auVar15._0_4_ = fVar10;
  auVar15._8_4_ = fVar10;
  auVar15._12_4_ = fVar10;
  auVar14 = vdivps_avx(auVar13,auVar15);
  local_b8[0] = local_b8[0] / fVar10;
  local_c0 = vmovlps_avx(auVar14);
  fVar10 = (up->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar14 = ZEXT416((uint)(up->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar14,auVar14);
  auVar13 = ZEXT416((uint)(up->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar14 = vfmadd213ss_fma(auVar13,auVar13,auVar14);
  if (auVar14._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar10 = auVar14._0_4_;
  }
  auVar16._0_4_ = (up->super_Tuple3<pbrt::Vector3,_float>).x / fVar10;
  auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar18._0_4_ = (up->super_Tuple3<pbrt::Vector3,_float>).y / fVar10;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar10 = (up->super_Tuple3<pbrt::Vector3,_float>).z / fVar10;
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)local_b8[0]),auVar18,
                            ZEXT416((uint)(fVar10 * local_c0._4_4_)));
  auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar10 * local_c0._4_4_)),ZEXT416((uint)fVar10),
                             ZEXT416((uint)local_c0._4_4_));
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)(float)local_c0),
                            ZEXT416((uint)(auVar16._0_4_ * local_b8[0])));
  auVar12 = vfnmadd213ss_fma(ZEXT416((uint)local_b8[0]),auVar16,
                             ZEXT416((uint)(auVar16._0_4_ * local_b8[0])));
  fVar10 = auVar12._0_4_ + auVar13._0_4_;
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)local_c0._4_4_),auVar16,
                            ZEXT416((uint)(auVar18._0_4_ * (float)local_c0)));
  auVar12 = vfnmadd213ss_fma(ZEXT416((uint)(float)local_c0),auVar18,
                             ZEXT416((uint)(auVar18._0_4_ * (float)local_c0)));
  auVar14 = ZEXT416((uint)(auVar14._0_4_ + auVar15._0_4_));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar14,auVar14);
  auVar13 = ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_));
  auVar14 = vfmadd231ss_fma(auVar14,auVar13,auVar13);
  if (auVar14._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar10 = auVar14._0_4_;
  }
  if ((fVar10 == 0.0) && (!NAN(fVar10))) {
    LogFatal<float_const&,float_const&,float_const&,float&,float&,float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/transform.cpp"
               ,0x5f,
               "LookAt: \"up\" vector (%f, %f, %f) and viewing direction (%f, %f, %f) passed to LookAt are pointing in the same direction."
               ,(float *)up,&(up->super_Tuple3<pbrt::Vector3,_float>).y,
               &(up->super_Tuple3<pbrt::Vector3,_float>).z,(float *)&local_c0,
               (float *)((long)&local_c0 + 4),local_b8);
  }
  fVar10 = (up->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar14 = ZEXT416((uint)(up->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar14,auVar14);
  auVar13 = ZEXT416((uint)(up->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar14 = vfmadd213ss_fma(auVar13,auVar13,auVar14);
  if (auVar14._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar10 = auVar14._0_4_;
  }
  auVar17._0_4_ = (up->super_Tuple3<pbrt::Vector3,_float>).x / fVar10;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar19._0_4_ = (up->super_Tuple3<pbrt::Vector3,_float>).y / fVar10;
  auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar10 = (up->super_Tuple3<pbrt::Vector3,_float>).z / fVar10;
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)local_b8[0]),auVar19,
                            ZEXT416((uint)(fVar10 * local_c0._4_4_)));
  auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar10 * local_c0._4_4_)),ZEXT416((uint)fVar10),
                             ZEXT416((uint)local_c0._4_4_));
  fVar3 = auVar14._0_4_ + auVar13._0_4_;
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)(float)local_c0),
                            ZEXT416((uint)(auVar17._0_4_ * local_b8[0])));
  auVar13 = vfnmadd213ss_fma(ZEXT416((uint)local_b8[0]),auVar17,
                             ZEXT416((uint)(auVar17._0_4_ * local_b8[0])));
  fVar10 = auVar13._0_4_ + auVar14._0_4_;
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)local_c0._4_4_),auVar17,
                            ZEXT416((uint)(auVar19._0_4_ * (float)local_c0)));
  auVar13 = vfnmadd213ss_fma(ZEXT416((uint)(float)local_c0),auVar19,
                             ZEXT416((uint)(auVar19._0_4_ * (float)local_c0)));
  fVar4 = auVar14._0_4_ + auVar13._0_4_;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),ZEXT416((uint)fVar3),
                            ZEXT416((uint)fVar3));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  if (auVar14._0_4_ < 0.0) {
    local_a8._0_4_ = fVar10;
    local_b0 = fVar3;
    local_ac = fVar4;
    fVar11 = sqrtf(auVar14._0_4_);
    fVar10 = (float)local_a8._0_4_;
    fVar4 = local_ac;
    fVar3 = local_b0;
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar11 = auVar14._0_4_;
  }
  cameraToWorld.m[0][0] = fVar3 / fVar11;
  cameraToWorld.m[1][0] = fVar10 / fVar11;
  cameraToWorld.m[2][0] = fVar4 / fVar11;
  auVar14 = vfmsub213ss_fma(ZEXT416((uint)cameraToWorld.m[1][0]),ZEXT416((uint)(float)local_c0),
                            ZEXT416((uint)(local_c0._4_4_ * cameraToWorld.m[0][0])));
  auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(local_c0._4_4_ * cameraToWorld.m[0][0])),
                             ZEXT416((uint)local_c0._4_4_),ZEXT416((uint)cameraToWorld.m[0][0]));
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)cameraToWorld.m[0][0]),ZEXT416((uint)local_b8[0]),
                            ZEXT416((uint)(cameraToWorld.m[2][0] * (float)local_c0)));
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(cameraToWorld.m[2][0] * (float)local_c0)),
                             ZEXT416((uint)(float)local_c0),ZEXT416((uint)cameraToWorld.m[2][0]));
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)cameraToWorld.m[2][0]),ZEXT416((uint)local_c0._4_4_),
                            ZEXT416((uint)(local_b8[0] * cameraToWorld.m[1][0])));
  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(local_b8[0] * cameraToWorld.m[1][0])),
                             ZEXT416((uint)local_b8[0]),ZEXT416((uint)cameraToWorld.m[1][0]));
  cameraToWorld.m[0][1] = auVar12._0_4_ + auVar18._0_4_;
  cameraToWorld.m[1][1] = auVar13._0_4_ + auVar16._0_4_;
  cameraToWorld.m[2][1] = auVar14._0_4_ + auVar15._0_4_;
  cameraToWorld.m[3][0] = 0.0;
  cameraToWorld.m[3][1] = 0.0;
  cameraToWorld.m[0][2] = (float)local_c0;
  cameraToWorld.m[1][2] = local_c0._4_4_;
  cameraToWorld.m[2][2] = local_b8[0];
  cameraToWorld.m[3][2] = 0.0;
  Inverse<4>(&cameraToWorld);
  if (worldToCamera.set) {
    *(undefined8 *)(__return_storage_ptr__->m).m[0] = worldToCamera.optionalValue._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = worldToCamera.optionalValue._8_8_;
    *(undefined8 *)(__return_storage_ptr__->m).m[1] = worldToCamera.optionalValue._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = worldToCamera.optionalValue._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m).m[2] = worldToCamera.optionalValue._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = worldToCamera.optionalValue._40_8_;
    *(undefined8 *)(__return_storage_ptr__->m).m[3] = worldToCamera.optionalValue._48_8_;
    *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = worldToCamera.optionalValue._56_8_;
    *(ulong *)(__return_storage_ptr__->mInv).m[0] =
         CONCAT44(cameraToWorld.m[0][1],cameraToWorld.m[0][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[0] + 2) =
         CONCAT44(cameraToWorld.m[0][3],cameraToWorld.m[0][2]);
    *(ulong *)(__return_storage_ptr__->mInv).m[1] =
         CONCAT44(cameraToWorld.m[1][1],cameraToWorld.m[1][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[1] + 2) =
         CONCAT44(cameraToWorld.m[1][3],cameraToWorld.m[1][2]);
    *(ulong *)(__return_storage_ptr__->mInv).m[2] =
         CONCAT44(cameraToWorld.m[2][1],cameraToWorld.m[2][0]);
    *(ulong *)((__return_storage_ptr__->mInv).m[2] + 2) =
         CONCAT44(cameraToWorld.m[2][3],cameraToWorld.m[2][2]);
    *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = cameraToWorld.m[3]._0_8_;
    *(ulong *)((__return_storage_ptr__->mInv).m[3] + 2) =
         CONCAT44(cameraToWorld.m[3][3],cameraToWorld.m[3][2]);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
}

Assistant:

Transform LookAt(const Point3f &pos, const Point3f &look, const Vector3f &up) {
    SquareMatrix<4> cameraToWorld;
    // Initialize fourth column of viewing matrix
    cameraToWorld[0][3] = pos.x;
    cameraToWorld[1][3] = pos.y;
    cameraToWorld[2][3] = pos.z;
    cameraToWorld[3][3] = 1;

    // Initialize first three columns of viewing matrix
    Vector3f dir = Normalize(look - pos);
    if (Length(Cross(Normalize(up), dir)) == 0)
        LOG_FATAL("LookAt: \"up\" vector (%f, %f, %f) and viewing direction "
                  "(%f, %f, %f) "
                  "passed to LookAt are pointing in the same direction.",
                  up.x, up.y, up.z, dir.x, dir.y, dir.z);
    Vector3f right = Normalize(Cross(Normalize(up), dir));
    Vector3f newUp = Cross(dir, right);
    cameraToWorld[0][0] = right.x;
    cameraToWorld[1][0] = right.y;
    cameraToWorld[2][0] = right.z;
    cameraToWorld[3][0] = 0.;
    cameraToWorld[0][1] = newUp.x;
    cameraToWorld[1][1] = newUp.y;
    cameraToWorld[2][1] = newUp.z;
    cameraToWorld[3][1] = 0.;
    cameraToWorld[0][2] = dir.x;
    cameraToWorld[1][2] = dir.y;
    cameraToWorld[2][2] = dir.z;
    cameraToWorld[3][2] = 0.;

    pstd::optional<SquareMatrix<4>> worldToCamera = Inverse(cameraToWorld);
#ifndef NDEBUG
    DCHECK(worldToCamera);
#endif  // !NDEBUG
    return Transform(*worldToCamera, cameraToWorld);
}